

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kv_instance.cc
# Opt level: O1

void fdb_kvs_find_cmp_chunk(void *chunk,void *aux,undefined1 **cmp_func_out,void **user_param_out)

{
  long lVar1;
  avl_node *paVar2;
  fdb_kvs_id_t kv_id;
  kvs_node query;
  fdb_kvs_id_t local_f8 [2];
  fdb_kvs_id_t local_e8;
  avl_node local_38;
  
  lVar1 = *(long *)(*(long *)((long)aux + 0x10) + 0x38);
  if (*(char *)(*(long *)(lVar1 + 0x170) + 0x28) != '\0') {
    buf2kvid((ulong)*aux,chunk,local_f8);
    if (local_f8[0] == 0) {
      *cmp_func_out = *(undefined1 **)(*(long *)(lVar1 + 0x170) + 8);
      paVar2 = *(avl_node **)(*(long *)(lVar1 + 0x170) + 0x10);
      goto LAB_0013e7da;
    }
    local_e8 = local_f8[0];
    pthread_spin_lock((pthread_spinlock_t *)(*(long *)(lVar1 + 0x170) + 0x38));
    paVar2 = avl_search(*(avl_tree **)(*(long *)(lVar1 + 0x170) + 0x20),&local_38,_kvs_cmp_id);
    pthread_spin_unlock((pthread_spinlock_t *)(*(long *)(lVar1 + 0x170) + 0x38));
    if (paVar2 != (avl_node *)0x0) {
      *cmp_func_out = (undefined1 *)paVar2[-7].right;
      paVar2 = paVar2[-6].parent;
      goto LAB_0013e7da;
    }
  }
  *cmp_func_out = (undefined1 *)0x0;
  paVar2 = (avl_node *)0x0;
LAB_0013e7da:
  *user_param_out = paVar2;
  return;
}

Assistant:

void fdb_kvs_find_cmp_chunk(void *chunk,
                            void *aux,
                            hbtrie_cmp_func** cmp_func_out,
                            void** user_param_out)
{
    fdb_kvs_id_t kv_id;
    struct hbtrie *trie = (struct hbtrie *)aux;
    struct btreeblk_handle *bhandle;
    struct filemgr *file;
    struct avl_node *a;
    struct kvs_node query, *node;

    bhandle = (struct btreeblk_handle*)trie->btreeblk_handle;
    file = bhandle->file;

    if (!file->kv_header->custom_cmp_enabled) {
        *cmp_func_out = NULL;
        *user_param_out = NULL;
        return;
    }

    buf2kvid(trie->chunksize, chunk, &kv_id);

    // search by id
    if (kv_id > 0) {
        query.id = kv_id;
        spin_lock(&file->kv_header->lock);
        a = avl_search(file->kv_header->idx_id, &query.avl_id, _kvs_cmp_id);
        spin_unlock(&file->kv_header->lock);

        if (a) {
            node = _get_entry(a, struct kvs_node, avl_id);
            *cmp_func_out = (hbtrie_cmp_func *)node->custom_cmp;
            *user_param_out = node->user_param;
            return;
        }
    } else {
        // root handle
        *cmp_func_out = (hbtrie_cmp_func *)file->kv_header->default_kvs_cmp;
        *user_param_out = file->kv_header->default_kvs_cmp_param;
        return;
    }
    *cmp_func_out = NULL;
    *user_param_out = NULL;
    return;
}